

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt * __thiscall slang::SVInt::operator^=(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  uint64_t *puVar2;
  ulong *puVar3;
  uint uVar4;
  SVInt *pSVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  uint local_20;
  byte local_1b;
  
  uVar7 = (this->super_SVIntStorage).bitWidth;
  uVar4 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar7 != uVar4) {
    bVar6 = (rhs->super_SVIntStorage).signFlag & (this->super_SVIntStorage).signFlag;
    if (uVar4 <= uVar7) {
      if (bVar6 == 0) {
        zext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      else {
        sext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      pSVar5 = operator^=(this,(SVInt *)&local_28);
      if ((local_20 < 0x41) && ((local_1b & 1) == 0)) {
        return pSVar5;
      }
      if ((void *)local_28.val == (void *)0x0) {
        return pSVar5;
      }
      operator_delete__(local_28.pVal);
      return pSVar5;
    }
    if (bVar6 == 0) {
      zext((SVInt *)&local_28,(bitwidth_t)this);
    }
    else {
      sext((SVInt *)&local_28,(bitwidth_t)this);
    }
    operator=(this,(SVInt *)&local_28);
    if (((0x40 < local_20) || ((local_1b & 1) != 0)) && ((void *)local_28.val != (void *)0x0)) {
      operator_delete__(local_28.pVal);
    }
  }
  bVar6 = (this->super_SVIntStorage).unknownFlag;
  if (((bool)bVar6 == false) && ((rhs->super_SVIntStorage).unknownFlag == true)) {
    makeUnknown(this);
    bVar6 = (this->super_SVIntStorage).unknownFlag;
  }
  uVar7 = (this->super_SVIntStorage).bitWidth;
  if (uVar7 < 0x41 && (bVar6 & 1) == 0) {
    (this->super_SVIntStorage).field_0.val =
         (this->super_SVIntStorage).field_0.val ^ (rhs->super_SVIntStorage).field_0.val;
  }
  else {
    uVar7 = uVar7 + 0x3f;
    uVar4 = uVar7 >> 6;
    if ((bVar6 & 1) == 0) {
      if (0x3f < uVar7) {
        uVar9 = 0;
        do {
          puVar3 = (this->super_SVIntStorage).field_0.pVal + uVar9;
          *puVar3 = *puVar3 ^ (rhs->super_SVIntStorage).field_0.pVal[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar4 != uVar9);
      }
    }
    else {
      bVar1 = (rhs->super_SVIntStorage).unknownFlag;
      if ((rhs->super_SVIntStorage).bitWidth < 0x41 && (bVar1 & 1U) == 0) {
        puVar3 = (this->super_SVIntStorage).field_0.pVal;
        *puVar3 = ((rhs->super_SVIntStorage).field_0.val ^ *puVar3) & ~puVar3[1];
      }
      else {
        if (0x3f < uVar7 && (~bVar1 & 1U) == 0) {
          uVar8 = (ulong)uVar4;
          uVar9 = uVar8;
          do {
            puVar3 = (this->super_SVIntStorage).field_0.pVal + uVar9;
            *puVar3 = *puVar3 | (rhs->super_SVIntStorage).field_0.pVal[uVar9];
            uVar9 = uVar9 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        if (0x3f < uVar7) {
          uVar9 = 0;
          do {
            puVar2 = (this->super_SVIntStorage).field_0.pVal;
            *(ulong *)((long)puVar2 + uVar9) =
                 (*(ulong *)((long)(rhs->super_SVIntStorage).field_0.pVal + uVar9) ^
                 *(ulong *)((long)puVar2 + uVar9)) &
                 ~*(ulong *)((long)puVar2 + (uVar4 << 3) + uVar9);
            uVar9 = uVar9 + 8;
          } while (uVar4 << 3 != uVar9);
        }
      }
    }
  }
  clearUnusedBits(this);
  return this;
}

Assistant:

SVInt& SVInt::operator^=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, bothSigned);
        else
            return *this ^= rhs.extend(bitWidth, bothSigned);
    }

    if (!hasUnknown() && rhs.hasUnknown())
        makeUnknown();

    if (isSingleWord())
        val ^= rhs.val;
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (unknownFlag) {
            if (rhs.isSingleWord())
                pVal[0] = ~pVal[1] & (pVal[0] ^ rhs.val);
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++)
                        pVal[i + words] |= rhs.pVal[i + words];
                }

                for (uint32_t i = 0; i < words; i++)
                    pVal[i] = ~pVal[i + words] & (pVal[i] ^ rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                pVal[i] ^= rhs.pVal[i];
        }
    }
    clearUnusedBits();
    return *this;
}